

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpdtrans.cpp
# Opt level: O0

void __thiscall
icu_63::CompoundTransliterator::CompoundTransliterator
          (CompoundTransliterator *this,UVector *list,UParseError *param_2,UErrorCode *status)

{
  UnicodeString local_68;
  UErrorCode *local_28;
  UErrorCode *status_local;
  UParseError *param_2_local;
  UVector *list_local;
  CompoundTransliterator *this_local;
  
  local_28 = status;
  status_local = &param_2->line;
  param_2_local = (UParseError *)list;
  list_local = (UVector *)this;
  icu_63::UnicodeString::UnicodeString(&local_68);
  Transliterator::Transliterator(&this->super_Transliterator,&local_68,(UnicodeFilter *)0x0);
  icu_63::UnicodeString::~UnicodeString(&local_68);
  (this->super_Transliterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CompoundTransliterator_005ba460;
  this->trans = (Transliterator **)0x0;
  this->numAnonymousRBTs = 0;
  init(this,(EVP_PKEY_CTX *)param_2_local);
  return;
}

Assistant:

CompoundTransliterator::CompoundTransliterator(UVector& list,
                                               UParseError& /*parseError*/,
                                               UErrorCode& status) :
    Transliterator(UnicodeString(), NULL),
    trans(0), numAnonymousRBTs(0)
{
    // TODO add code for parseError...currently unused, but
    // later may be used by parsing code...
    init(list, UTRANS_FORWARD, FALSE, status);
    // assume caller will fixup ID
}